

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

Integer * copy_map64(int64_t *block,int block_ndim,int64_t *map)

{
  Integer *pIVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  Integer *_ga_map_capi;
  int64_t map_offset;
  int64_t capi_offset;
  int64_t sum;
  int64_t i;
  int d;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  
  local_30 = 0;
  local_40 = 0;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    local_30 = *(long *)(in_RDI + (long)local_1c * 8) + local_30;
  }
  pIVar1 = (Integer *)malloc(local_30 << 3);
  local_38 = local_30;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    local_38 = local_38 - *(long *)(in_RDI + (long)local_1c * 8);
    for (local_28 = 0; local_28 < *(long *)(in_RDI + (long)local_1c * 8); local_28 = local_28 + 1) {
      pIVar1[local_38 + local_28] = *(long *)(in_RDX + (local_40 + local_28) * 8) + 1;
    }
    local_40 = *(long *)(in_RDI + (long)local_1c * 8) + local_40;
  }
  return pIVar1;
}

Assistant:

static Integer* copy_map64(int64_t block[], int block_ndim, int64_t map[])
{
    int d;
    int64_t i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}